

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O1

void M3x3_Transpose(double (*m) [3])

{
  long lVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  bool bVar8;
  
  pdVar3 = *m + 1;
  pdVar6 = m[1];
  lVar4 = 0;
  do {
    lVar5 = 1;
    pdVar7 = pdVar6;
    do {
      dVar2 = pdVar3[lVar5 + -1];
      pdVar3[lVar5 + -1] = *pdVar7;
      *pdVar7 = dVar2;
      pdVar7 = pdVar7 + 3;
      lVar1 = lVar4 + lVar5;
      lVar5 = lVar5 + 1;
    } while (lVar1 != 2);
    pdVar3 = pdVar3 + 4;
    pdVar6 = pdVar6 + 4;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  return;
}

Assistant:

void M3x3_Transpose(double m[3][3])
{
   int i, j;
   double temp;

    for (i=0 ; i<2 ; i++)
    {
        for (j=i+1 ; j<3 ; j++)
        {
            temp   = m[i][j];
            m[i][j] = m[j][i];
            m[j][i] = temp;
        }
    }
}